

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O0

void __thiscall TasGrid::GridSequence::differentiate(GridSequence *this,double *x,double *jacobian)

{
  value_type vVar1;
  double dVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  reference pvVar6;
  reference pvVar7;
  int iVar8;
  int local_b8;
  int local_b4;
  int j_3;
  int k_1;
  int j_2;
  int j_1;
  int k;
  int j;
  double *s;
  int *p;
  int i;
  int n;
  allocator<double> local_79;
  undefined1 local_78 [8];
  vector<double,_std::allocator<double>_> diff_values;
  undefined1 local_50 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  derivative_cache;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  value_cache;
  double *jacobian_local;
  double *x_local;
  GridSequence *this_local;
  
  cacheBasisValues<double>
            ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&derivative_cache.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,this,x);
  cacheBasisDerivatives<double>
            ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_50,this,x);
  iVar3 = (this->super_BaseCanonicalGrid).num_dimensions;
  ::std::allocator<double>::allocator(&local_79);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_78,(long)iVar3,&local_79);
  ::std::allocator<double>::~allocator(&local_79);
  _i = 0.0;
  ::std::fill_n<double*,int,double>
            (jacobian,(this->super_BaseCanonicalGrid).num_outputs *
                      (this->super_BaseCanonicalGrid).num_dimensions,(double *)&i);
  iVar3 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  for (p._0_4_ = 0; (int)p < iVar3; p._0_4_ = (int)p + 1) {
    piVar4 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,(int)p);
    pdVar5 = Data2D<double>::getStrip(&this->surpluses,(int)p);
    pvVar6 = ::std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)local_50,0);
    pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)*piVar4);
    vVar1 = *pvVar7;
    pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_78,0);
    *pvVar7 = vVar1;
    for (j_1 = 1; j_1 < (this->super_BaseCanonicalGrid).num_dimensions; j_1 = j_1 + 1) {
      pvVar6 = ::std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&derivative_cache.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)*piVar4);
      vVar1 = *pvVar7;
      pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_78,(long)j_1);
      *pvVar7 = vVar1;
    }
    for (j_2 = 1; j_2 < (this->super_BaseCanonicalGrid).num_dimensions; j_2 = j_2 + 1) {
      for (k_1 = 0; k_1 < j_2; k_1 = k_1 + 1) {
        pvVar6 = ::std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&derivative_cache.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)j_2);
        pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar6,(long)piVar4[j_2]);
        dVar2 = *pvVar7;
        pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_78,(long)k_1);
        *pvVar7 = dVar2 * *pvVar7;
      }
      pvVar6 = ::std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)local_50,(long)j_2);
      pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)piVar4[j_2]);
      dVar2 = *pvVar7;
      pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_78,(long)j_2);
      *pvVar7 = dVar2 * *pvVar7;
      j_3 = j_2;
      while (j_3 = j_3 + 1, j_3 < (this->super_BaseCanonicalGrid).num_dimensions) {
        pvVar6 = ::std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&derivative_cache.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)j_2);
        pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar6,(long)piVar4[j_2]);
        dVar2 = *pvVar7;
        pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_78,(long)j_3);
        *pvVar7 = dVar2 * *pvVar7;
      }
    }
    for (local_b4 = 0; local_b4 < (this->super_BaseCanonicalGrid).num_outputs;
        local_b4 = local_b4 + 1) {
      for (local_b8 = 0; local_b8 < (this->super_BaseCanonicalGrid).num_dimensions;
          local_b8 = local_b8 + 1) {
        dVar2 = pdVar5[local_b4];
        pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_78,(long)local_b8);
        iVar8 = local_b4 * (this->super_BaseCanonicalGrid).num_dimensions + local_b8;
        jacobian[iVar8] = dVar2 * *pvVar7 + jacobian[iVar8];
      }
    }
  }
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_78);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_50);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&derivative_cache.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void GridSequence::differentiate(const double x[], double jacobian[]) const {
    // Based on the logic in the TasGrid::GridSequence::evaluate() and TasGrid::GridSequence::getDifferentiationWeights() functions.
    std::vector<std::vector<double>> value_cache = cacheBasisValues<double>(x);
    std::vector<std::vector<double>> derivative_cache = cacheBasisDerivatives<double>(x);
    std::vector<double> diff_values(num_dimensions);
    std::fill_n(jacobian, num_outputs * num_dimensions, 0.0);
    int n = points.getNumIndexes();
    for(int i=0; i<n; i++) {
        const int* p = points.getIndex(i);
        const double *s = surpluses.getStrip(i);

        diff_values[0] = derivative_cache[0][p[0]];
        for(int j=1; j<num_dimensions; j++) diff_values[j] = value_cache[0][p[0]];

        for(int k=1; k<num_dimensions; k++) {
            for(int j=0; j<k; j++) diff_values[j] *= value_cache[k][p[k]];
            diff_values[k] *= derivative_cache[k][p[k]];
            for(int j=k+1; j<num_dimensions; j++) diff_values[j] *= value_cache[k][p[k]];
        }
        for(int k=0; k<num_outputs; k++)
            for(int j=0; j<num_dimensions; j++)
                jacobian[k * num_dimensions + j] += s[k] * diff_values[j];
    }
}